

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

char * Ses_ManExtractSolution(Ses_Man_t *pSes)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  void *__ptr;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  size_t __nmemb;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  
  uVar10 = pSes->nGates;
  iVar16 = pSes->nSpecVars;
  iVar2 = pSes->nSpecFunc;
  __nmemb = (size_t)(int)((iVar16 + 2) * iVar2 + uVar10 * 4 + 3);
  pcVar5 = (char *)calloc(__nmemb,1);
  *pcVar5 = (char)iVar16;
  pcVar5[1] = (char)iVar2;
  pcVar9 = pcVar5 + 3;
  pcVar5[2] = (char)uVar10;
  iVar16 = 0;
  do {
    if ((int)uVar10 <= iVar16) {
      if (pSes->nMaxDepth == -1) {
        __ptr = (void *)0x0;
      }
      else {
        uVar11 = pSes->nSpecVars;
        __ptr = calloc((long)(int)(uVar11 * uVar10),4);
        uVar6 = 0;
        if (0 < (int)uVar11) {
          uVar6 = (ulong)uVar11;
        }
        uVar8 = 0;
        if (0 < (int)uVar10) {
          uVar8 = (ulong)uVar10;
        }
        pvVar12 = __ptr;
        for (uVar13 = 0; uVar13 != uVar8; uVar13 = uVar13 + 1) {
          uVar14 = (uint)pcVar5[uVar13 * 4 + 5];
          uVar15 = (uint)pcVar5[uVar13 * 4 + 6];
          for (uVar17 = 0; uVar6 != uVar17; uVar17 = uVar17 + 1) {
            iVar2 = 0;
            iVar16 = 0;
            if ((int)uVar11 <= (int)uVar14) {
              iVar16 = *(int *)((long)__ptr +
                               uVar17 * 4 + (long)(int)((uVar14 - uVar11) * uVar11) * 4);
            }
            if ((int)uVar11 <= (int)uVar15) {
              iVar2 = *(int *)((long)__ptr +
                              uVar17 * 4 + (long)(int)((uVar15 - uVar11) * uVar11) * 4);
            }
            if (iVar16 == 0 && iVar2 == 0) {
              uVar7 = (uint)(uVar15 == uVar17 || uVar14 == uVar17);
            }
            else {
              if (iVar2 < iVar16) {
                iVar2 = iVar16;
              }
              uVar7 = iVar2 + 1;
            }
            *(uint *)((long)pvVar12 + uVar17 * 4) = uVar7;
          }
          pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar11 * 4);
        }
      }
      for (uVar11 = 0; (int)uVar11 < pSes->nSpecFunc; uVar11 = uVar11 + 1) {
        for (iVar16 = 0; iVar16 < (int)uVar10; iVar16 = iVar16 + 1) {
          psVar1 = pSes->pSat;
          iVar2 = Ses_ManOutputVar(pSes,uVar11,iVar16);
          iVar2 = sat_solver_var_value(psVar1,iVar2);
          if (iVar2 != 0) {
            iVar2 = Abc_Var2Lit(iVar16,(uint)(((uint)pSes->bSpecInv >> (uVar11 & 0x1f) & 1) != 0));
            *pcVar9 = (char)iVar2;
            if (pSes->nMaxDepth == -1) {
              uVar6 = 0;
            }
            else {
              uVar10 = pSes->nSpecVars;
              uVar8 = 0;
              uVar13 = 0;
              if (0 < (int)uVar10) {
                uVar13 = (ulong)uVar10;
              }
              uVar6 = 0;
              for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
                if (pSes->pArrTimeProfile == (int *)0x0) {
                  uVar14 = *(uint *)((long)__ptr + uVar8 * 4 + (long)(int)(uVar10 * iVar16) * 4);
                }
                else {
                  uVar14 = *(int *)((long)__ptr + uVar8 * 4 + (long)(int)(uVar10 * iVar16) * 4) +
                           pSes->pArrTimeProfile[uVar8];
                }
                if ((int)uVar6 <= (int)uVar14) {
                  uVar6 = (ulong)uVar14;
                }
              }
            }
            pcVar9[1] = (char)uVar6;
            if ((pSes->pArrTimeProfile != (int *)0x0) && (pSes->fExtractVerbose != 0)) {
              printf("output %d points to gate %d and has normalized delay %d (nArrTimeDelta = %d)\n"
                     ,uVar11,(ulong)(uint)(pSes->nSpecVars + iVar16),uVar6,
                     (ulong)(uint)pSes->nArrTimeDelta);
            }
            for (uVar6 = 0; (long)uVar6 < (long)pSes->nSpecVars; uVar6 = uVar6 + 1) {
              if (pSes->nMaxDepth == -1) {
                uVar8 = 0;
              }
              else {
                uVar8 = (ulong)*(uint *)((long)__ptr +
                                        (long)(pSes->nSpecVars * iVar16 + (int)uVar6) * 4);
              }
              if ((pSes->pArrTimeProfile != (int *)0x0) && (pSes->fExtractVerbose != 0)) {
                printf("  pin-to-pin arrival time from input %d is %d (pArrTimeProfile = %d)\n",
                       uVar6 & 0xffffffff,uVar8);
              }
              pcVar9[uVar6 + 2] = (char)uVar8;
            }
            pcVar9 = pcVar9 + uVar6 + 2;
          }
          uVar10 = pSes->nGates;
        }
      }
      if ((__ptr != (void *)0x0) && (pSes->nMaxDepth != -1)) {
        free(__ptr);
      }
      if ((long)pcVar9 - (long)pcVar5 != __nmemb) {
        __assert_fail("( p - pSol ) == nSol",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                      ,0x6d4,"char *Ses_ManExtractSolution(Ses_Man_t *)");
      }
      return pcVar5;
    }
    psVar1 = pSes->pSat;
    iVar2 = Ses_ManGateVar(pSes,iVar16,0,1);
    iVar2 = sat_solver_var_value(psVar1,iVar2);
    psVar1 = pSes->pSat;
    iVar3 = Ses_ManGateVar(pSes,iVar16,1,0);
    iVar3 = sat_solver_var_value(psVar1,iVar3);
    psVar1 = pSes->pSat;
    iVar4 = Ses_ManGateVar(pSes,iVar16,1,1);
    iVar4 = sat_solver_var_value(psVar1,iVar4);
    *pcVar9 = (char)iVar2 + (char)iVar3 * '\x02' + (char)iVar4 * '\x04';
    pcVar9[1] = '\x02';
    if (pSes->fExtractVerbose != 0) {
      printf("add gate %d with operation %d");
    }
    pcVar9 = pcVar9 + 2;
    uVar6 = 0;
    while (iVar2 = (int)uVar6, iVar2 < pSes->nSpecVars + iVar16) {
      uVar13 = 0;
      uVar8 = 0;
      if (0 < iVar2) {
        uVar8 = uVar6;
      }
      while (iVar3 = (int)uVar13, (int)uVar8 != iVar3) {
        psVar1 = pSes->pSat;
        iVar4 = Ses_ManSelectVar(pSes,iVar16,iVar3,iVar2);
        iVar4 = sat_solver_var_value(psVar1,iVar4);
        if (iVar4 != 0) {
          if (pSes->fExtractVerbose != 0) {
            printf(" and operands %d and %d",uVar13,uVar6);
          }
          *pcVar9 = (char)uVar13;
          pcVar9[1] = (char)uVar6;
          pcVar9 = pcVar9 + 2;
          iVar2 = pSes->nSpecVars + iVar16;
          break;
        }
        uVar13 = (ulong)(iVar3 + 1);
      }
      uVar6 = (ulong)(iVar2 + 1);
    }
    if (pSes->fExtractVerbose != 0) {
      if (0 < pSes->nMaxDepth) {
        printf(" and depth vector ");
        for (iVar2 = 0; iVar2 <= pSes->nArrTimeMax + iVar16; iVar2 = iVar2 + 1) {
          psVar1 = pSes->pSat;
          iVar3 = Ses_ManDepthVar(pSes,iVar16,iVar2);
          sat_solver_var_value(psVar1,iVar3);
          printf("%d");
        }
      }
      putchar(10);
    }
    iVar16 = iVar16 + 1;
    uVar10 = pSes->nGates;
  } while( true );
}

Assistant:

static char * Ses_ManExtractSolution( Ses_Man_t * pSes )
{
    int nSol, h, i, j, k, l, aj, ak, d, nOp;
    char * pSol, * p;
    int * pPerm = NULL; /* will be a 2d array [i][l] where is is gate id and l is PI id */

    /* compute length of solution, for now all gates have 2 inputs */
    nSol = 3 + pSes->nGates * 4 + pSes->nSpecFunc * ( 2 + pSes->nSpecVars );

    p = pSol = ABC_CALLOC( char, nSol );

    /* header */
    *p++ = pSes->nSpecVars;
    *p++ = pSes->nSpecFunc;
    *p++ = pSes->nGates;

    /* gates */
    for ( i = 0; i < pSes->nGates; ++i )
    {
        nOp  = sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 0, 1 ) );
        nOp |= sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 1, 0 ) ) << 1;
        nOp |= sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 1, 1 ) ) << 2;

        *p++ = nOp;
        *p++ = 2;

        if ( pSes->fExtractVerbose )
            printf( "add gate %d with operation %d", pSes->nSpecVars + i, nOp );

        for ( k = 0; k < pSes->nSpecVars + i; ++k )
            for ( j = 0; j < k; ++j )
                if ( sat_solver_var_value( pSes->pSat, Ses_ManSelectVar( pSes, i, j, k ) ) )
                {
                    if ( pSes->fExtractVerbose )
                        printf( " and operands %d and %d", j, k );
                    *p++ = j;
                    *p++ = k;
                    k = pSes->nSpecVars + i;
                    break;
                }

        if ( pSes->fExtractVerbose )
        {
            if ( pSes->nMaxDepth > 0 )
            {
                printf( " and depth vector " );
                for ( j = 0; j <= pSes->nArrTimeMax + i; ++j )
                    printf( "%d", sat_solver_var_value( pSes->pSat, Ses_ManDepthVar( pSes, i, j ) ) );
            }
            printf( "\n" );
        }
    }

    /* pin-to-pin delay */
    if ( pSes->nMaxDepth != -1 )
    {
        pPerm = ABC_CALLOC( int, pSes->nGates * pSes->nSpecVars );
        for ( i = 0; i < pSes->nGates; ++i )
        {
            /* since all gates are binary for now */
            j = pSol[3 + i * 4 + 2];
            k = pSol[3 + i * 4 + 3];

            for ( l = 0; l < pSes->nSpecVars; ++l )
            {
                /* pin-to-pin delay to input l of child nodes */
                aj = j < pSes->nSpecVars ? 0 : pPerm[(j - pSes->nSpecVars) * pSes->nSpecVars + l];
                ak = k < pSes->nSpecVars ? 0 : pPerm[(k - pSes->nSpecVars) * pSes->nSpecVars + l];

                if ( aj == 0 && ak == 0 )
                    pPerm[i * pSes->nSpecVars + l] = ( l == j || l == k ) ? 1 : 0;
                else
                    pPerm[i * pSes->nSpecVars + l] = Abc_MaxInt( aj, ak ) + 1;
            }
        }
    }

    /* outputs */
    for ( h = 0; h < pSes->nSpecFunc; ++h )
        for ( i = 0; i < pSes->nGates; ++i )
            if ( sat_solver_var_value( pSes->pSat, Ses_ManOutputVar( pSes, h, i ) ) )
            {
                *p++ = Abc_Var2Lit( i, ( pSes->bSpecInv >> h ) & 1 );
                d = 0;
                if ( pSes->nMaxDepth != -1 )
                    for ( l = 0; l < pSes->nSpecVars; ++l )
                    {
                        if ( pSes->pArrTimeProfile )
                            d = Abc_MaxInt( d, pSes->pArrTimeProfile[l] + pPerm[i * pSes->nSpecVars + l] );
                        else
                            d = Abc_MaxInt( d, pPerm[i * pSes->nSpecVars + l] );
                    }
                *p++ = d;
                if ( pSes->pArrTimeProfile && pSes->fExtractVerbose )
                    printf( "output %d points to gate %d and has normalized delay %d (nArrTimeDelta = %d)\n", h, pSes->nSpecVars + i, d, pSes->nArrTimeDelta );
                for ( l = 0; l < pSes->nSpecVars; ++l )
                {
                    d = ( pSes->nMaxDepth != -1 ) ? pPerm[i * pSes->nSpecVars + l] : 0;
                    if ( pSes->pArrTimeProfile && pSes->fExtractVerbose )
                        printf( "  pin-to-pin arrival time from input %d is %d (pArrTimeProfile = %d)\n", l, d, pSes->pArrTimeProfile[l] );
                    *p++ = d;
                }
            }

    /* pin-to-pin delays */
    if ( pSes->nMaxDepth != -1 )
        ABC_FREE( pPerm );

    /* have we used all the fields? */
    assert( ( p - pSol ) == nSol );

    /* printf( "found network: " ); */
    /* Abc_TtPrintHexRev( stdout, Ses_ManDeriveTruth( pSes, pSol, 1 ), pSes->nSpecVars ); */
    /* printf( "\n" ); */

    return pSol;
}